

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::StringPtr> * kj::consumeWord(char **ptr)

{
  byte bVar1;
  Maybe<kj::StringPtr> *pMVar2;
  long lVar3;
  undefined1 *in_RDI;
  
  for (pMVar2 = (Maybe<kj::StringPtr> *)*ptr;
      (bVar1 = (pMVar2->ptr).isSet, bVar1 == 9 || (bVar1 == 0x20));
      pMVar2 = (Maybe<kj::StringPtr> *)&(pMVar2->ptr).field_0x1) {
  }
  lVar3 = 1;
  do {
    if (bVar1 < 10) {
      if (bVar1 == 0) {
        *ptr = (char *)((long)pMVar2 + lVar3 + -1);
        goto LAB_003e8f68;
      }
      if (bVar1 == 9) {
LAB_003e8f50:
        *ptr = &(pMVar2->ptr).isSet + lVar3;
        *(undefined1 *)((long)pMVar2 + lVar3 + -1) = 0;
LAB_003e8f68:
        *in_RDI = 1;
        *(Maybe<kj::StringPtr> **)(in_RDI + 8) = pMVar2;
        *(long *)(in_RDI + 0x10) = lVar3;
        return pMVar2;
      }
    }
    else {
      if ((bVar1 == 10) || (bVar1 == 0xd)) {
        *in_RDI = 0;
        return pMVar2;
      }
      if (bVar1 == 0x20) goto LAB_003e8f50;
    }
    bVar1 = (&(pMVar2->ptr).isSet)[lVar3];
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static kj::Maybe<kj::StringPtr> consumeWord(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\t':
      case ' ': {
        char* end = p++;
        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n':
      case '\r':
        // Not expecting EOL!
        return kj::none;

      default:
        ++p;
        break;
    }
  }
}